

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highs_c_api.cpp
# Opt level: O0

HighsInt Highs_passModelName(void *highs,char *name)

{
  HighsStatus HVar1;
  Highs *in_RSI;
  string *in_RDI;
  allocator local_31;
  string local_30 [48];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,(char *)in_RSI,&local_31);
  HVar1 = Highs::passModelName(in_RSI,in_RDI);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  return HVar1;
}

Assistant:

HighsInt Highs_passModelName(const void* highs, const char* name) {
  return (HighsInt)((Highs*)highs)->passModelName(std::string(name));
}